

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment.hpp
# Opt level: O2

LCC_API_VIRTUALIZATION_SUMMARY __thiscall
license::os::ExecutionEnvironment::virtualization(ExecutionEnvironment *this)

{
  bool bVar1;
  LCC_API_VIRTUALIZATION_DETAIL_conflict LVar2;
  LCC_API_VIRTUALIZATION_SUMMARY LVar3;
  
  if (this->m_container_type != NONE) {
    return CONTAINER;
  }
  LVar2 = virtualization_detail(this);
  if (LVar2 == BARE_TO_METAL) {
    bVar1 = is_cloud(this);
    LVar3 = (uint)bVar1 * 2;
  }
  else {
    LVar3 = VM;
  }
  return LVar3;
}

Assistant:

bool is_container() const { return m_container_type != CONTAINER_TYPE::NONE; }